

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::image::anon_unknown_0::LoadStoreTestInstance::verifyResult
          (TestStatus *__return_storage_ptr__,LoadStoreTestInstance *this)

{
  long lVar1;
  TestLog *log;
  LoadStoreTestInstance *pLVar2;
  bool bVar3;
  VkFormat VVar4;
  int iVar5;
  DeviceInterface *pDVar6;
  undefined4 extraout_var;
  int z;
  int iVar7;
  int iVar8;
  int iVar9;
  int y;
  int iVar10;
  int x;
  int iVar11;
  TextureFormat local_138;
  ConstPixelBufferAccess local_130;
  DeviceInterface *local_108;
  LoadStoreTestInstance *local_100;
  ConstPixelBufferAccess local_f8;
  ConstPixelBufferAccess result;
  PixelBufferAccess reference;
  ConstPixelBufferAccess local_80;
  ConstPixelBufferAccess local_58;
  
  pDVar6 = Context::getDeviceInterface((this->super_BaseTestInstance).super_TestInstance.m_context);
  local_130.m_data = Context::getDevice((this->super_BaseTestInstance).super_TestInstance.m_context)
  ;
  local_100 = this;
  tcu::TextureLevel::getAccess
            ((PixelBufferAccess *)&reference.super_ConstPixelBufferAccess,&this->m_referenceImage);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&local_f8,&reference.super_ConstPixelBufferAccess);
  VVar4 = ::vk::mapTextureFormat(&local_f8.m_format);
  bVar3 = isIntegerFormat(VVar4);
  iVar7 = 0;
  iVar5 = local_f8.m_size.m_data[0] / 2;
  if (local_f8.m_size.m_data[0] / 2 < 1) {
    iVar5 = 0;
  }
  local_108 = pDVar6;
  if (bVar3) {
    for (iVar7 = 0; iVar7 < local_f8.m_size.m_data[2]; iVar7 = iVar7 + 1) {
      for (iVar10 = 0; iVar10 < local_f8.m_size.m_data[1]; iVar10 = iVar10 + 1) {
        iVar9 = local_f8.m_size.m_data[0] + -1;
        for (iVar11 = 0; iVar5 != iVar11; iVar11 = iVar11 + 1) {
          iVar8 = (int)&local_f8;
          tcu::ConstPixelBufferAccess::getPixelUint(&result,iVar8,iVar9,iVar10);
          tcu::ConstPixelBufferAccess::getPixelUint(&local_130,iVar8,iVar11,iVar10);
          tcu::PixelBufferAccess::setPixel
                    ((PixelBufferAccess *)&local_f8,(UVec4 *)&local_130,iVar9,iVar10,iVar7);
          tcu::PixelBufferAccess::setPixel
                    ((PixelBufferAccess *)&local_f8,(UVec4 *)&result,iVar11,iVar10,iVar7);
          iVar9 = iVar9 + -1;
        }
      }
    }
  }
  else {
    for (; iVar7 < local_f8.m_size.m_data[2]; iVar7 = iVar7 + 1) {
      for (iVar10 = 0; iVar10 < local_f8.m_size.m_data[1]; iVar10 = iVar10 + 1) {
        iVar9 = local_f8.m_size.m_data[0] + -1;
        for (iVar11 = 0; iVar5 != iVar11; iVar11 = iVar11 + 1) {
          iVar8 = (int)&local_f8;
          tcu::ConstPixelBufferAccess::getPixel(&result,iVar8,iVar9,iVar10);
          tcu::ConstPixelBufferAccess::getPixel(&local_130,iVar8,iVar11,iVar10);
          tcu::PixelBufferAccess::setPixel
                    ((PixelBufferAccess *)&local_f8,(Vec4 *)&local_130,iVar9,iVar10,iVar7);
          tcu::PixelBufferAccess::setPixel
                    ((PixelBufferAccess *)&local_f8,(Vec4 *)&result,iVar11,iVar10,iVar7);
          iVar9 = iVar9 + -1;
        }
      }
    }
  }
  pLVar2 = local_100;
  iVar5 = (*(local_100->super_BaseTestInstance).super_TestInstance._vptr_TestInstance[10])
                    (local_100);
  lVar1 = *(long *)CONCAT44(extraout_var,iVar5);
  ::vk::invalidateMappedMemoryRange
            (local_108,(VkDevice)local_130.m_data,(VkDeviceMemory)*(deUint64 *)(lVar1 + 8),
             *(VkDeviceSize *)(lVar1 + 0x10),pLVar2->m_imageSizeBytes);
  local_138 = ::vk::mapVkFormat(pLVar2->m_imageFormat);
  Texture::size((Texture *)&local_130);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&result,&local_138,(IVec3 *)&local_130,*(void **)(lVar1 + 0x18));
  log = ((pLVar2->super_BaseTestInstance).super_TestInstance.m_context)->m_testCtx->m_log;
  VVar4 = pLVar2->m_imageFormat;
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&local_58,&reference.super_ConstPixelBufferAccess);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_80,&result);
  bVar3 = comparePixelBuffers(log,&(pLVar2->super_BaseTestInstance).m_texture,VVar4,&local_58,
                              &local_80);
  if (bVar3) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,"Passed",(allocator<char> *)&local_138);
    tcu::TestStatus::pass(__return_storage_ptr__,(string *)&local_130);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,"Image comparison failed",(allocator<char> *)&local_138);
    tcu::TestStatus::fail(__return_storage_ptr__,(string *)&local_130);
  }
  std::__cxx11::string::~string((string *)&local_130);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus LoadStoreTestInstance::verifyResult	(void)
{
	const DeviceInterface&	vk		= m_context.getDeviceInterface();
	const VkDevice			device	= m_context.getDevice();

	// Apply the same transformation as done in the shader
	const tcu::PixelBufferAccess reference = m_referenceImage.getAccess();
	flipHorizontally(reference);

	const Allocation& alloc = getResultBuffer()->getAllocation();
	invalidateMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), m_imageSizeBytes);
	const tcu::ConstPixelBufferAccess result(mapVkFormat(m_imageFormat), m_texture.size(), alloc.getHostPtr());

	if (comparePixelBuffers(m_context.getTestContext().getLog(), m_texture, m_imageFormat, reference, result))
		return tcu::TestStatus::pass("Passed");
	else
		return tcu::TestStatus::fail("Image comparison failed");
}